

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecStr.h
# Opt level: O2

void Vec_StrPutI(Vec_Str_t *vOut,int Val)

{
  while( true ) {
    if (Val < 0x80) break;
    Vec_StrPush(vOut,(byte)Val | 0x80);
    Val = (uint)Val >> 7;
  }
  Vec_StrPush(vOut,(byte)Val);
  return;
}

Assistant:

static inline void Vec_StrPutI( Vec_Str_t * vOut, int Val )
{
    for ( ; Val >= 0x80; Val >>= 7 )
        Vec_StrPush( vOut, (unsigned char)(Val | 0x80) );
    Vec_StrPush( vOut, (unsigned char)Val );
}